

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.pb.cc
# Opt level: O1

char * __thiscall google::protobuf::Api::_InternalParse(Api *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  ArenaStringPtr *this_01;
  ArenaStringPtr *this_02;
  byte bVar1;
  byte bVar2;
  int iVar3;
  string *psVar4;
  Rep *pRVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  bool bVar8;
  SourceContext *pSVar9;
  Option *msg;
  Method *msg_00;
  Mixin *msg_01;
  uint uVar10;
  char *field_name;
  char *pcVar11;
  uint32 res32;
  Arena *pAVar12;
  UnknownFieldSet *unknown;
  byte *p;
  internal *this_03;
  char cVar13;
  uint res;
  pair<const_char_*,_unsigned_int> pVar14;
  pair<const_char_*,_unsigned_long> pVar15;
  StringPiece str;
  byte *local_38;
  char *ptr_local;
  char *size;
  
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  this_01 = &this->version_;
  this_02 = &this->name_;
  local_38 = (byte *)ptr;
  do {
    bVar8 = internal::EpsCopyInputStream::DoneWithCheck
                      (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    if (bVar8) {
      return (char *)local_38;
    }
    bVar1 = *local_38;
    res = (uint)bVar1;
    p = local_38 + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*p * 0x80) - 0x80;
      if ((char)*p < '\0') {
        pVar14 = internal::ReadTagFallback((char *)local_38,res);
        p = (byte *)pVar14.first;
        res = pVar14.second;
      }
      else {
        p = local_38 + 2;
      }
    }
    local_38 = p;
    if (p == (byte *)0x0) {
LAB_0025aec3:
      cVar13 = '\x04';
      goto LAB_0025aeb8;
    }
    uVar10 = (res >> 3) - 1;
    if (6 < uVar10) {
switchD_0025aa9b_default:
      if (res == 0 || (res & 7) == 4) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        cVar13 = '\r';
      }
      else {
        if (((ulong)this_00->ptr_ & 1) == 0) {
          unknown = internal::InternalMetadata::
                    mutable_unknown_fields_slow<google::protobuf::UnknownFieldSet>(this_00);
        }
        else {
          unknown = (UnknownFieldSet *)(((ulong)this_00->ptr_ & 0xfffffffffffffffe) + 8);
        }
        local_38 = (byte *)internal::UnknownFieldParse((ulong)res,unknown,(char *)local_38,ctx);
LAB_0025ae81:
        cVar13 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
      }
      goto LAB_0025aeb8;
    }
    field_name = (char *)((long)&switchD_0025aa9b::switchdataD_00350f60 +
                         (long)(int)(&switchD_0025aa9b::switchdataD_00350f60)[uVar10]);
    cVar13 = (char)res;
    switch(res >> 3) {
    case 1:
      if (cVar13 != '\n') goto switchD_0025aa9b_default;
      pAVar12 = (Arena *)this_00->ptr_;
      if (((ulong)pAVar12 & 1) != 0) {
        pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
      }
      if (this_02->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (this_02,pAVar12,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      }
      psVar4 = this_02->ptr_;
      local_38 = (byte *)internal::InlineGreedyStringParser(psVar4,(char *)local_38,ctx);
      this_03 = (internal *)(psVar4->_M_dataplus)._M_p;
      size = (char *)psVar4->_M_string_length;
      if ((long)size < 0) {
        StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
      }
      pcVar11 = "google.protobuf.Api.name";
      goto LAB_0025ac85;
    case 2:
      if (cVar13 != '\x12') goto switchD_0025aa9b_default;
      local_38 = p + -1;
      do {
        local_38 = local_38 + 1;
        pRVar5 = (this->methods_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar5 == (Rep *)0x0) {
LAB_0025accc:
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->methods_).super_RepeatedPtrFieldBase,
                     (this->methods_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0025acdb:
          pRVar5 = (this->methods_).super_RepeatedPtrFieldBase.rep_;
          pRVar5->allocated_size = pRVar5->allocated_size + 1;
          msg_00 = Arena::CreateMaybeMessage<google::protobuf::Method>
                             ((this->methods_).super_RepeatedPtrFieldBase.arena_);
          pRVar5 = (this->methods_).super_RepeatedPtrFieldBase.rep_;
          iVar3 = (this->methods_).super_RepeatedPtrFieldBase.current_size_;
          (this->methods_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
          pRVar5->elements[iVar3] = msg_00;
        }
        else {
          iVar3 = (this->methods_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar5->allocated_size <= iVar3) {
            if (pRVar5->allocated_size == (this->methods_).super_RepeatedPtrFieldBase.total_size_)
            goto LAB_0025accc;
            goto LAB_0025acdb;
          }
          (this->methods_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
          msg_00 = (Method *)pRVar5->elements[iVar3];
        }
        local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::Method>
                                     (ctx,msg_00,(char *)local_38);
        if (local_38 == (byte *)0x0) goto LAB_0025aec3;
        cVar13 = '\x02';
      } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x12));
      break;
    case 3:
      if (cVar13 != '\x1a') goto switchD_0025aa9b_default;
      local_38 = p + -1;
      do {
        local_38 = local_38 + 1;
        pRVar5 = (this->options_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar5 == (Rep *)0x0) {
LAB_0025ab7c:
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->options_).super_RepeatedPtrFieldBase,
                     (this->options_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0025ab8b:
          pRVar5 = (this->options_).super_RepeatedPtrFieldBase.rep_;
          pRVar5->allocated_size = pRVar5->allocated_size + 1;
          msg = Arena::CreateMaybeMessage<google::protobuf::Option>
                          ((this->options_).super_RepeatedPtrFieldBase.arena_);
          pRVar5 = (this->options_).super_RepeatedPtrFieldBase.rep_;
          iVar3 = (this->options_).super_RepeatedPtrFieldBase.current_size_;
          (this->options_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
          pRVar5->elements[iVar3] = msg;
        }
        else {
          iVar3 = (this->options_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar5->allocated_size <= iVar3) {
            if (pRVar5->allocated_size == (this->options_).super_RepeatedPtrFieldBase.total_size_)
            goto LAB_0025ab7c;
            goto LAB_0025ab8b;
          }
          (this->options_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
          msg = (Option *)pRVar5->elements[iVar3];
        }
        local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::Option>
                                     (ctx,msg,(char *)local_38);
        if (local_38 == (byte *)0x0) goto LAB_0025aec3;
        cVar13 = '\x02';
      } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x1a));
      break;
    case 4:
      if (cVar13 != '\"') goto switchD_0025aa9b_default;
      pAVar12 = (Arena *)this_00->ptr_;
      if (((ulong)pAVar12 & 1) != 0) {
        pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
      }
      if (this_01->ptr_ == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
        internal::ArenaStringPtr::CreateInstance
                  (this_01,pAVar12,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
      }
      psVar4 = this_01->ptr_;
      local_38 = (byte *)internal::InlineGreedyStringParser(psVar4,(char *)local_38,ctx);
      this_03 = (internal *)(psVar4->_M_dataplus)._M_p;
      size = (char *)psVar4->_M_string_length;
      if ((long)size < 0) {
        StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
      }
      pcVar11 = "google.protobuf.Api.version";
LAB_0025ac85:
      str.length_ = (stringpiece_ssize_type)pcVar11;
      str.ptr_ = size;
      bVar8 = internal::VerifyUTF8(this_03,str,field_name);
      cVar13 = (local_38 == (byte *)0x0) * '\x02' + '\x02';
      if (!bVar8) {
        cVar13 = '\x04';
      }
      break;
    case 5:
      if (cVar13 != '*') goto switchD_0025aa9b_default;
      if (this->source_context_ == (SourceContext *)0x0) {
        pAVar12 = (Arena *)this_00->ptr_;
        if (((ulong)pAVar12 & 1) != 0) {
          pAVar12 = *(Arena **)((ulong)pAVar12 & 0xfffffffffffffffe);
        }
        pSVar9 = Arena::CreateMaybeMessage<google::protobuf::SourceContext>(pAVar12);
        this->source_context_ = pSVar9;
      }
      local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::SourceContext>
                                   (ctx,this->source_context_,(char *)local_38);
      goto LAB_0025ae81;
    case 6:
      if (cVar13 != '2') goto switchD_0025aa9b_default;
      local_38 = p + -1;
      do {
        local_38 = local_38 + 1;
        pRVar5 = (this->mixins_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar5 == (Rep *)0x0) {
LAB_0025ad78:
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->mixins_).super_RepeatedPtrFieldBase,
                     (this->mixins_).super_RepeatedPtrFieldBase.total_size_ + 1);
LAB_0025ad87:
          pRVar5 = (this->mixins_).super_RepeatedPtrFieldBase.rep_;
          pRVar5->allocated_size = pRVar5->allocated_size + 1;
          msg_01 = Arena::CreateMaybeMessage<google::protobuf::Mixin>
                             ((this->mixins_).super_RepeatedPtrFieldBase.arena_);
          pRVar5 = (this->mixins_).super_RepeatedPtrFieldBase.rep_;
          iVar3 = (this->mixins_).super_RepeatedPtrFieldBase.current_size_;
          (this->mixins_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
          pRVar5->elements[iVar3] = msg_01;
        }
        else {
          iVar3 = (this->mixins_).super_RepeatedPtrFieldBase.current_size_;
          if (pRVar5->allocated_size <= iVar3) {
            if (pRVar5->allocated_size == (this->mixins_).super_RepeatedPtrFieldBase.total_size_)
            goto LAB_0025ad78;
            goto LAB_0025ad87;
          }
          (this->mixins_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
          msg_01 = (Mixin *)pRVar5->elements[iVar3];
        }
        local_38 = (byte *)internal::ParseContext::ParseMessage<google::protobuf::Mixin>
                                     (ctx,msg_01,(char *)local_38);
        if (local_38 == (byte *)0x0) goto LAB_0025aec3;
        cVar13 = '\x02';
      } while ((local_38 < (ctx->super_EpsCopyInputStream).limit_end_) && (*local_38 == 0x32));
      break;
    case 7:
      if (cVar13 != '8') goto switchD_0025aa9b_default;
      bVar1 = *p;
      auVar7._8_8_ = (long)(char)bVar1;
      auVar7._0_8_ = p + 1;
      auVar6 = auVar7._0_12_;
      if ((long)(char)bVar1 < 0) {
        bVar2 = p[1];
        res32 = ((uint)bVar2 * 0x80 + (uint)bVar1) - 0x80;
        if ((char)bVar2 < '\0') {
          pVar15 = internal::VarintParseSlow64((char *)p,res32);
          auVar6 = pVar15._0_12_;
        }
        else {
          auVar6._8_4_ = res32;
          auVar6._0_8_ = p + 2;
        }
      }
      local_38 = auVar6._0_8_;
      cVar13 = '\x04';
      if (local_38 != (byte *)0x0) {
        this->syntax_ = auVar6._8_4_;
        cVar13 = '\x02';
      }
    }
LAB_0025aeb8:
    if (cVar13 != '\x02') {
      if (cVar13 == '\x04') {
        local_38 = (byte *)0x0;
      }
      return (char *)local_38;
    }
  } while( true );
}

Assistant:

const char* Api::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArena(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // string name = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 10)) {
          auto str = _internal_mutable_name();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Api.name"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.Method methods = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 18)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_methods(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<18>(ptr));
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.Option options = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 26)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_options(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<26>(ptr));
        } else goto handle_unusual;
        continue;
      // string version = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 34)) {
          auto str = _internal_mutable_version();
          ptr = ::PROTOBUF_NAMESPACE_ID::internal::InlineGreedyStringParser(str, ptr, ctx);
          CHK_(::PROTOBUF_NAMESPACE_ID::internal::VerifyUTF8(str, "google.protobuf.Api.version"));
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // .google.protobuf.SourceContext source_context = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 42)) {
          ptr = ctx->ParseMessage(_internal_mutable_source_context(), ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.Mixin mixins = 6;
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 50)) {
          ptr -= 1;
          do {
            ptr += 1;
            ptr = ctx->ParseMessage(_internal_add_mixins(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<50>(ptr));
        } else goto handle_unusual;
        continue;
      // .google.protobuf.Syntax syntax = 7;
      case 7:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 56)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_syntax(static_cast<PROTOBUF_NAMESPACE_ID::Syntax>(val));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
        ptr = UnknownFieldParse(tag,
            _internal_metadata_.mutable_unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(),
            ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}